

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  ZSTD_paramSwitch_e ZVar2;
  BYTE *source;
  BYTE *pBVar3;
  symbolEncodingType_e sVar4;
  int iVar5;
  uint uVar6;
  size_t err_code_3;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong sourceSize;
  size_t err_code;
  undefined8 uVar12;
  HUF_repeat local_a4;
  ZSTD_symbolEncodingTypeStats_t local_70;
  ulong local_48;
  ZSTD_CCtx_params *local_40;
  seqStore_t *local_38;
  
  source = seqStorePtr->litStart;
  pBVar3 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  ZVar2 = cctxParams->literalCompressionMode;
  local_40 = cctxParams;
  local_38 = seqStorePtr;
  if (ZVar2 == ZSTD_ps_auto) {
    if (ZVar1 != ZSTD_fast) goto LAB_001bb09c;
    uVar6 = (cctxParams->cParams).targetLength;
    local_70.LLtype = 0xff;
    local_a4 = (prevEntropy->huf).repeatMode;
    memcpy(nextEntropy,prevEntropy,0x810);
    sVar4 = set_basic;
    if (uVar6 == 0) goto LAB_001bb0de;
LAB_001bb2dd:
    (entropyMetadata->hufMetadata).hType = sVar4;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  else {
    if (ZVar2 != ZSTD_ps_enable) {
      if (ZVar2 != ZSTD_ps_disable) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x264,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
      }
      local_70.LLtype = 0xff;
LAB_001bb02d:
      memcpy(nextEntropy,prevEntropy,0x810);
      sVar4 = set_basic;
      goto LAB_001bb2dd;
    }
LAB_001bb09c:
    local_70.LLtype = 0xff;
    local_a4 = (prevEntropy->huf).repeatMode;
    memcpy(nextEntropy,prevEntropy,0x810);
LAB_001bb0de:
    sourceSize = (long)pBVar3 - (long)source;
    uVar10 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar10 = 6;
    }
    sVar4 = set_basic;
    if (sourceSize <= uVar10) goto LAB_001bb2dd;
    sVar7 = HIST_count_wksp((uint *)workspace,&local_70.LLtype,source,sourceSize,workspace,wkspSize)
    ;
    if (0xffffffffffffff88 < sVar7) {
LAB_001bb3c4:
      (entropyMetadata->hufMetadata).hufDesSize = sVar7;
      return sVar7;
    }
    sVar4 = set_rle;
    if ((sVar7 == sourceSize) || (sVar4 = set_basic, sVar7 <= (sourceSize >> 7) + 4))
    goto LAB_001bb2dd;
    local_48 = (ulong)((uint)(ZSTD_btopt < ZVar1) * 2);
    workSpace = (void *)((long)workspace + 0x400);
    sVar9 = wkspSize - 0x400;
    if (local_a4 == HUF_repeat_check) {
      iVar5 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_70.LLtype);
      local_a4 = (HUF_repeat)(iVar5 != 0);
    }
    memset(nextEntropy,0,0x808);
    uVar6 = HUF_optimalTableLog(0xb,sourceSize,local_70.LLtype,workSpace,sVar9,
                                (HUF_CElt *)nextEntropy,(uint *)workspace,(int)local_48);
    if (0xb < uVar6) {
      __assert_fail("huffLog <= LitHufLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xdd5,
                    "size_t ZSTD_buildBlockEntropyStats_literals(void *const, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_hufCTablesMetadata_t *, const int, void *, size_t, int)"
                   );
    }
    sVar7 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,local_70.LLtype,uVar6,workSpace,
                       sVar9);
    if (0xffffffffffffff88 < sVar7) goto LAB_001bb3c4;
    sVar8 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,local_70.LLtype);
    sVar7 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       local_70.LLtype,(uint)sVar7,workSpace,sVar9);
    if (((local_a4 != HUF_repeat_none) &&
        (sVar9 = HUF_estimateCompressedSize
                           ((HUF_CElt *)prevEntropy,(uint *)workspace,local_70.LLtype),
        sVar9 < sourceSize)) && (sourceSize <= sVar7 + 0xc || sVar9 <= sVar7 + sVar8)) {
      memcpy(nextEntropy,prevEntropy,0x810);
      sVar4 = set_repeat;
      goto LAB_001bb2dd;
    }
    if (sourceSize <= sVar8 + sVar7) goto LAB_001bb02d;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = sVar7;
    if (0xffffffffffffff88 < sVar7) {
      return sVar7;
    }
  }
  lVar11 = (long)local_38->sequences - (long)local_38->sequencesStart;
  if (lVar11 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar12 = 0;
    local_70.MLtype = set_basic;
    local_70.size = 0;
    local_70.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_70,local_38,lVar11 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(local_40->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < local_70.size) goto LAB_001bb3a0;
    uVar12 = CONCAT44(local_70.Offtype,local_70.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar12;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar12 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = local_70.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = local_70.lastCountSize;
LAB_001bb3a0:
  (entropyMetadata->fseMetadata).fseTablesSize = local_70.size;
  uVar10 = 0;
  if (0xffffffffffffff88 < local_70.size) {
    uVar10 = local_70.size;
  }
  return uVar10;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}